

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

int Cof_ManCountRemoved(Cof_Man_t *p,Cof_Obj_t *pRoot,int fConst1)

{
  uint *puVar1;
  Cof_Obj_t *pObj;
  int *piVar2;
  Gia_Man_t *p_00;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  
  uVar3 = p->nTravIds + 1;
  p->nTravIds = uVar3;
  pRoot->Value = uVar3;
  iVar4 = Cof_ObjLevel(p,pRoot);
  piVar2 = p->pLevels;
  lVar8 = (long)iVar4;
  if (piVar2[lVar8] != 0) {
    __assert_fail("p->pLevels[LevelStart] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                  ,0x1c8,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
  }
  pRoot->iNext = 0;
  piVar2[lVar8] = (int)((ulong)((long)pRoot - (long)p->pObjData) >> 2);
  if ((uint)fConst1 < 2) {
    pRoot->iLit = fConst1;
    iVar13 = 0;
    if (iVar4 < p->nLevels) {
      iVar13 = 0;
      do {
        uVar3 = p->pLevels[lVar8];
        while (uVar3 != 0) {
          uVar7 = p->pObjData[(ulong)uVar3 + 5];
          if ((int)uVar7 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          puVar1 = (uint *)(p->pObjData + uVar3);
          if (puVar1[3] == uVar7 >> 1) {
            __assert_fail("pTemp->Id != Abc_Lit2Var(pTemp->iLit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                          ,0x1d4,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
          }
          uVar3 = *puVar1;
          if (0xff < uVar3) {
            lVar12 = 0;
            do {
              if ((puVar1[puVar1[(ulong)(uVar3 >> 4 & 0xf) + lVar12 + 6] & 0x7fffffff] & 0xf1) !=
                  0x11) {
                pObj = (Cof_Obj_t *)
                       (puVar1 + (puVar1[(ulong)(uVar3 >> 4 & 0xf) + lVar12 + 6] & 0x7fffffff));
                uVar3 = p->nTravIds;
                if (pObj->Value != uVar3) {
                  puVar9 = (uint *)((long)pObj + ((ulong)*(uint *)(pObj + 1) & 0x7fffffff) * -4);
                  puVar6 = (uint *)((long)pObj + ((ulong)pObj[1].nFanoutsM & 0x7fffffff) * -4);
                  if ((puVar9 != puVar1) && (puVar6 != puVar1)) {
                    __assert_fail("pFanin0 == pTemp || pFanin1 == pTemp",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                                  ,0x1dd,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
                  }
                  iVar4 = pObj->Id;
                  if (((long)iVar4 < 0) || (p_00 = p->pGia, p_00->nObjs <= iVar4)) {
                    __assert_fail("v >= 0 && v < p->nObjs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                  }
                  pGVar10 = p_00->pObjs + iVar4;
                  if (puVar9[2] == uVar3) {
                    if ((int)puVar9[5] < 0) goto LAB_0070c4a0;
                    uVar7 = *(uint *)pGVar10 >> 0x1d & 1 ^ puVar9[5];
                  }
                  else {
                    iVar11 = iVar4 - (*(uint *)pGVar10 & 0x1fffffff);
                    if (iVar11 < 0) goto LAB_0070c481;
                    uVar7 = (*(uint *)pGVar10 >> 0x1d & 1) + iVar11 * 2;
                  }
                  if (puVar6[2] == uVar3) {
                    if ((int)puVar6[5] < 0) {
LAB_0070c4a0:
                      __assert_fail("Lit >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                                    ,0x132,"int Abc_LitNotCond(int, int)");
                    }
                    uVar3 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x3d) & 1 ^ puVar6[5];
                  }
                  else {
                    uVar3 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20);
                    iVar4 = iVar4 - (uVar3 & 0x1fffffff);
                    if (iVar4 < 0) goto LAB_0070c481;
                    uVar3 = (uVar3 >> 0x1d & 1) + iVar4 * 2;
                  }
                  iVar4 = Gia_ManHashAndTry(p_00,uVar7,uVar3);
                  if (iVar4 != -1) {
                    pObj->Value = p->nTravIds;
                    pObj->iLit = iVar4;
                    iVar4 = Cof_ObjLevel(p,pObj);
                    lVar5 = (long)iVar4;
                    if ((lVar5 <= lVar8) || (p->nLevels <= iVar4)) {
                      __assert_fail("LevelNext > i && LevelNext < p->nLevels",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                                    ,0x1ef,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)")
                      ;
                    }
                    piVar2 = p->pLevels;
                    pObj->iNext = piVar2[lVar5];
                    piVar2[lVar5] = (int)((ulong)((long)pObj - (long)p->pObjData) >> 2);
                    iVar13 = iVar13 + 1;
                  }
                }
              }
              uVar3 = *puVar1;
              lVar12 = lVar12 + 1;
            } while ((uint)lVar12 < uVar3 >> 8);
          }
          uVar3 = puVar1[4];
        }
        p->pLevels[lVar8] = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 < p->nLevels);
    }
    return iVar13;
  }
LAB_0070c481:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Cof_ManCountRemoved( Cof_Man_t * p, Cof_Obj_t * pRoot, int fConst1 )
{
    Gia_Obj_t * pNextGia;
    Cof_Obj_t * pTemp, * pNext, * pFanin0, * pFanin1;
    int Counter = 0, LevelStart, LevelNext;
    int i, k, iHandle, iLit0, iLit1, iNextNew;
    // restart the trav ids
    Cof_ManIncrementTravId( p );
    Cof_ObjSetTravIdCurrent( p, pRoot );
    // add the node to the queue
    LevelStart = Cof_ObjLevel(p, pRoot);
    assert( p->pLevels[LevelStart] == 0 );
    pRoot->iNext = 0;
    p->pLevels[LevelStart] = Cof_ObjHandle( p, pRoot );
    // set the new literal
    pRoot->iLit = Abc_Var2Lit( 0, fConst1 );
    // process nodes in the levelized order
    for ( i = LevelStart; i < p->nLevels; i++ )
    {
        for ( iHandle = p->pLevels[i]; 
              iHandle && (pTemp = Cof_ManObj(p, iHandle)); 
              iHandle = pTemp->iNext )
        {
            assert( pTemp->Id != Abc_Lit2Var(pTemp->iLit) );
            Cof_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( Cof_ObjIsCo(pNext) )
                    continue;
                if ( Cof_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                pFanin0 = Cof_ObjFanin( pNext, 0 );
                pFanin1 = Cof_ObjFanin( pNext, 1 );
                assert( pFanin0 == pTemp || pFanin1 == pTemp );
                pNextGia = Gia_ManObj( p->pGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin0) )
                    iLit0 = Abc_LitNotCond( pFanin0->iLit, Gia_ObjFaninC0(pNextGia) );
                else
                    iLit0 = Gia_ObjFaninLit0( pNextGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin1) )
                    iLit1 = Abc_LitNotCond( pFanin1->iLit, Gia_ObjFaninC1(pNextGia) );
                else
                    iLit1 = Gia_ObjFaninLit1( pNextGia, pNext->Id );
                iNextNew = Gia_ManHashAndTry( p->pGia, iLit0, iLit1 );
                if ( iNextNew == -1 )
                    continue;
                Cof_ObjSetTravIdCurrent(p, pNext);
                // set the new literal
                pNext->iLit = iNextNew;
                // add it to be processed
                LevelNext = Cof_ObjLevel( p, pNext );
                assert( LevelNext > i && LevelNext < p->nLevels );
                pNext->iNext = p->pLevels[LevelNext];
                p->pLevels[LevelNext] = Cof_ObjHandle( p, pNext );
                Counter++;
            }
        }
        p->pLevels[i] = 0;
    }
    return Counter;
}